

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

BSDFSample * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (DielectricInterfaceBxDF *this,Vector3f wo,Float uc,Point2f *u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined1 auVar1 [16];
  bool bVar2;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  float *in_RSI;
  BSDFSample *in_RDI;
  BxDFReflTransFlags in_R8D;
  long *in_FS_OFFSET;
  float fVar6;
  Float FVar7;
  Float FVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  Normal3<float> NVar25;
  Vector3f VVar26;
  Vector3<float> VVar27;
  Float pdf_1;
  Float dwh_dwi;
  SampledSpectrum f_1;
  Float factor;
  Float sqrtDenom;
  bool tir_1;
  Vector3f wi_3;
  Float etap_1;
  SampledSpectrum f;
  Float cosTheta_i;
  Float cosTheta_o;
  Float pdf;
  Vector3f wi_2;
  Float pt_1;
  Float pr_1;
  Float T_1;
  Float R_1;
  Float F;
  Vector3f wh;
  SampledSpectrum ft;
  bool tir;
  Vector3f wi_1;
  Float etap;
  bool entering;
  SampledSpectrum fr;
  Vector3f wi;
  Float pt;
  Float pr;
  Float T;
  Float R;
  float in_stack_fffffffffffffd68;
  Float in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  Float in_stack_fffffffffffffd7c;
  Float in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  float fVar28;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  StatRegisterer *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  float fVar29;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  Tuple3<pbrt::Vector3,_float> *n;
  Vector3f *in_stack_fffffffffffffdd0;
  Vector3f *wo_00;
  LogLevel LVar30;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  TrowbridgeReitzDistribution *in_stack_fffffffffffffde0;
  float local_218;
  SampledSpectrum local_1f0;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Vector3f *in_stack_fffffffffffffe38;
  _lambda_pbrt__StatsAccumulator___3_ local_1a9 [16];
  byte local_199;
  Vector3f local_198;
  float local_18c;
  SampledSpectrum local_188;
  Float local_178;
  float local_174;
  float local_170;
  _lambda_pbrt__StatsAccumulator___2_ local_169;
  Tuple3<pbrt::Vector3,_float> local_168;
  Tuple3<pbrt::Vector3,_float> local_154;
  float local_148;
  Float local_144;
  float local_140;
  Float local_13c;
  Tuple3<pbrt::Vector3,_float> local_138;
  Vector3f local_128;
  Tuple3<pbrt::Vector3,_float> local_11c;
  Tuple3<pbrt::Vector3,_float> local_110;
  Tuple3<pbrt::Vector3,_float> local_100;
  Float local_f4;
  Tuple3<pbrt::Vector3,_float> local_f0;
  Tuple3<pbrt::Vector3,_float> local_e0;
  SampledSpectrum local_d4 [2];
  _lambda_pbrt__StatsAccumulator___1_ local_b1;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_90;
  float local_88;
  byte local_81;
  Vector3f local_80;
  float local_74;
  undefined1 local_6d;
  SampledSpectrum local_6c;
  Vector3f local_5c;
  float local_50;
  Float local_4c;
  float local_48;
  Float local_44;
  BxDFReflTransFlags local_40;
  int local_3c;
  float local_2c;
  Tuple3<pbrt::Vector3,_float> local_1c;
  Tuple3<pbrt::Vector3,_float> local_c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar24 [56];
  
  FVar7 = (Float)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_1c._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  auVar24 = (undefined1  [56])0x0;
  local_c._0_8_ = local_1c._0_8_;
  if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
    local_40 = in_R8D;
    local_3c = in_ECX;
    local_2c = in_XMM2_Da;
    bVar2 = TrowbridgeReitzDistribution::EffectivelySpecular
                      ((TrowbridgeReitzDistribution *)0x7e503b);
    if (bVar2) {
      CosTheta((Vector3f *)&local_c);
      local_4c = FrDielectric(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
      local_50 = 1.0 - local_4c;
      local_48 = local_50;
      local_44 = local_4c;
      iVar4 = operator&(local_40,Reflection);
      if (iVar4 == 0) {
        local_4c = 0.0;
      }
      iVar4 = operator&(local_40,Transmission);
      if (iVar4 == 0) {
        local_50 = 0.0;
      }
      if ((((local_4c != 0.0) || (NAN(local_4c))) || (local_50 != 0.0)) || (NAN(local_50))) {
        if (local_4c / (local_4c + local_50) <= local_2c) {
          FVar8 = CosTheta((Vector3f *)&local_c);
          local_6d = 0.0 < FVar8;
          if ((bool)local_6d) {
            local_218 = *in_RSI;
          }
          else {
            local_218 = 1.0 / *in_RSI;
          }
          local_74 = local_218;
          Vector3<float>::Vector3((Vector3<float> *)0x7e52b4);
          auVar24 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
          Normal3<float>::Normal3
                    ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                     ,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
          NVar25 = FaceForward<float>((Normal3<float> *)
                                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                      (Vector3<float> *)
                                      CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
          ;
          local_a8 = NVar25.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar16._0_8_ = NVar25.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar16._8_56_ = auVar24;
          local_b0 = vmovlpd_avx(auVar16._0_16_);
          local_90 = local_b0;
          local_88 = local_a8;
          bVar2 = Refract(in_stack_fffffffffffffe38,
                          (Normal3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          FVar7,(Vector3f *)
                                CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          local_81 = (bVar2 ^ 0xffU) & 1;
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar4 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                           ::reg), iVar4 != 0)) {
            Sample_f(pbrt::Vector3,float,pbrt::Point2_const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
            ::{lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_b1);
            StatRegisterer::StatRegisterer
                      (in_stack_fffffffffffffda0,
                       (AccumFunc)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                      );
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(*in_FS_OFFSET + -0x1d8) = *(long *)(*in_FS_OFFSET + -0x1d8) + 1;
          if ((local_81 & 1) != 0) {
            *(long *)(*in_FS_OFFSET + -0x1e0) = *(long *)(*in_FS_OFFSET + -0x1e0) + 1;
          }
          if ((local_81 & 1) == 0) {
            AbsCosTheta((Vector3f *)0x7e5444);
            SampledSpectrum::SampledSpectrum
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd6c);
            if (local_3c == 0) {
              Sqr<float>(local_74);
              SampledSpectrum::operator/=
                        ((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         in_stack_fffffffffffffd7c);
            }
            BSDFSample::BSDFSample
                      (in_RDI,local_d4,&local_80,local_50 / (local_4c + local_50),
                       SpecularTransmission);
          }
          else {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          }
        }
        else {
          Vector3<float>::Vector3
                    ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                     ,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
          AbsCosTheta((Vector3f *)0x7e51d2);
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd6c);
          BSDFSample::BSDFSample
                    (in_RDI,&local_6c,&local_5c,local_4c / (local_4c + local_50),SpecularReflection)
          ;
        }
      }
      else {
        memset(in_RDI,0,0x24);
        BSDFSample::BSDFSample
                  ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
    }
    else {
      iVar4 = (int)((ulong)&local_c >> 0x20);
      VVar26 = TrowbridgeReitzDistribution::Sample_wm
                         (in_stack_fffffffffffffde0,
                          (Vector3f *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          (Point2f *)in_stack_fffffffffffffdd0);
      local_f0.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar24;
      local_f0._0_8_ = vmovlpd_avx(auVar17._0_16_);
      n = &local_e0;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      VVar26 = Reflect(in_stack_fffffffffffffdd0,(Vector3f *)n);
      local_110.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar24;
      local_110._0_8_ = vmovlpd_avx(auVar18._0_16_);
      wo_00 = &local_128;
      auVar24 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
      local_100._0_8_ = local_110._0_8_;
      local_100.z = local_110.z;
      Vector3<float>::Vector3
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
      VVar27 = FaceForward<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                  (Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      local_138.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar24;
      local_138._0_8_ = vmovlpd_avx(auVar19._0_16_);
      local_11c._0_8_ = local_138._0_8_;
      local_11c.z = local_138.z;
      Dot<float>((Vector3<float> *)&local_100,(Vector3<float> *)&local_11c);
      local_144 = FrDielectric(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
      local_148 = 1.0 - local_144;
      local_140 = local_148;
      local_13c = local_144;
      local_f4 = local_144;
      iVar5 = operator&(local_40,Reflection);
      if (iVar5 == 0) {
        local_144 = 0.0;
      }
      iVar5 = operator&(local_40,Transmission);
      if (iVar5 == 0) {
        local_148 = 0.0;
      }
      if (((local_144 != 0.0) || (NAN(local_144))) || ((local_148 != 0.0 || (NAN(local_148))))) {
        auVar24 = ZEXT856(0);
        if (local_144 / (local_144 + local_148) <= local_2c) {
          FVar8 = CosTheta((Vector3f *)&local_c);
          LVar30 = (LogLevel)((ulong)wo_00 >> 0x20);
          if (FVar8 <= 0.0) {
            fVar6 = 1.0 / *in_RSI;
          }
          else {
            fVar6 = *in_RSI;
          }
          local_18c = fVar6;
          Vector3<float>::Vector3((Vector3<float> *)0x7e5ac7);
          Normal3<float>::Normal3<float>
                    ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                     ,(Vector3<float> *)
                      CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          bVar2 = Refract(in_stack_fffffffffffffe38,
                          (Normal3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          FVar7,(Vector3f *)
                                CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          local_199 = (bVar2 ^ 0xffU) & 1;
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar5 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                           ::reg), iVar5 != 0)) {
            Sample_f(pbrt::Vector3,float,pbrt::Point2_const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
            ::{lambda(pbrt::StatsAccumulator&)#3}::operator_cast_to_function_pointer(local_1a9);
            StatRegisterer::StatRegisterer
                      (in_stack_fffffffffffffda0,
                       (AccumFunc)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                      );
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(*in_FS_OFFSET + -0x1b8) = *(long *)(*in_FS_OFFSET + -0x1b8) + 1;
          if ((local_199 & 1) != 0) {
            *(long *)(*in_FS_OFFSET + -0x1c0) = *(long *)(*in_FS_OFFSET + -0x1c0) + 1;
          }
          bVar2 = SameHemisphere((Vector3f *)&local_c,&local_198);
          if (bVar2) {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          }
          else if (((local_199 & 1) == 0) &&
                  ((local_198.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                   (NAN(local_198.super_Tuple3<pbrt::Vector3,_float>.z))))) {
            auVar24 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
            Normal3<float>::Normal3
                      ((Normal3<float> *)
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
            VVar27 = FaceForward<float>((Vector3<float> *)
                                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90
                                                ),
                                        (Normal3<float> *)
                                        CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                                                ));
            local_e0.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar21._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar21._8_56_ = auVar24;
            local_e0._0_8_ = vmovlpd_avx(auVar21._0_16_);
            fVar9 = Dot<float>((Vector3<float> *)&local_c,(Vector3<float> *)&local_e0);
            fVar29 = local_18c;
            auVar22._0_4_ = Dot<float>(&local_198,(Vector3<float> *)&local_e0);
            auVar22._4_60_ = extraout_var;
            auVar1 = vfmadd213ss_fma(auVar22._0_16_,ZEXT416((uint)fVar29),ZEXT416((uint)fVar9));
            fVar9 = auVar1._0_4_;
            if (local_3c == 0) {
              fVar10 = Sqr<float>(1.0 / local_18c);
            }
            else {
              fVar10 = 1.0;
            }
            fVar28 = (1.0 - local_f4) * fVar10;
            FVar7 = TrowbridgeReitzDistribution::D
                              ((TrowbridgeReitzDistribution *)
                               CONCAT44(fVar10,in_stack_fffffffffffffd98),
                               (Vector3f *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
            FVar8 = TrowbridgeReitzDistribution::G
                              ((TrowbridgeReitzDistribution *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                               (Vector3f *)
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                               (Vector3f *)CONCAT44(FVar7,in_stack_fffffffffffffd70));
            fVar10 = FVar7 * FVar8;
            fVar11 = AbsDot<float>((Vector3<float> *)CONCAT44(FVar7,in_stack_fffffffffffffd70),
                                   (Vector3<float> *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            fVar10 = fVar10 * fVar11;
            fVar11 = AbsDot<float>((Vector3<float> *)CONCAT44(FVar7,in_stack_fffffffffffffd70),
                                   (Vector3<float> *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            fVar10 = fVar10 * fVar11;
            FVar8 = AbsCosTheta((Vector3f *)0x7e5e37);
            iVar5 = (int)&local_c;
            FVar12 = AbsCosTheta((Vector3f *)0x7e5e4a);
            fVar11 = FVar8 * FVar12;
            Sqr<float>(fVar9);
            std::abs(iVar5);
            SampledSpectrum::SampledSpectrum
                      ((SampledSpectrum *)CONCAT44(FVar7,in_stack_fffffffffffffd70),
                       in_stack_fffffffffffffd6c);
            fVar13 = AbsDot<float>((Vector3<float> *)CONCAT44(FVar7,in_stack_fffffffffffffd70),
                                   (Vector3<float> *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            fVar14 = Dot<float>((Vector3<float> *)&local_c,(Vector3<float> *)&local_e0);
            fVar9 = local_18c;
            auVar23._0_4_ = Dot<float>(&local_198,(Vector3<float> *)&local_e0);
            auVar23._4_60_ = extraout_var_00;
            auVar1 = vfmadd213ss_fma(auVar23._0_16_,ZEXT416((uint)fVar9),ZEXT416((uint)fVar14));
            fVar15 = Sqr<float>(auVar1._0_4_);
            FVar7 = TrowbridgeReitzDistribution::PDF
                              ((TrowbridgeReitzDistribution *)CONCAT44(fVar9,fVar14),
                               (Vector3f *)CONCAT44(fVar28,fVar10),
                               (Vector3f *)CONCAT44(fVar11,FVar8));
            fVar10 = FVar7 * (fVar13 / fVar15) * local_148;
            fVar9 = local_144 + local_148;
            eVar3 = IsNaN<float>(0.0);
            if (eVar3) {
              LogFatal<char_const(&)[12]>
                        (LVar30,(char *)n,iVar4,
                         (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (char (*) [12])CONCAT44(fVar6,fVar29));
            }
            BSDFSample::BSDFSample(in_RDI,&local_1f0,&local_198,fVar10 / fVar9,GlossyTransmission);
          }
          else {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          }
        }
        else {
          VVar26 = Reflect(wo_00,(Vector3f *)n);
          LVar30 = (LogLevel)((ulong)wo_00 >> 0x20);
          local_168.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar20._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar20._8_56_ = auVar24;
          local_168._0_8_ = vmovlpd_avx(auVar20._0_16_);
          local_154._0_8_ = local_168._0_8_;
          local_154.z = local_168.z;
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar5 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                           ::reg), iVar5 != 0)) {
            Sample_f(pbrt::Vector3,float,pbrt::Point2_const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const
            ::{lambda(pbrt::StatsAccumulator&)#2}::operator_cast_to_function_pointer(&local_169);
            StatRegisterer::StatRegisterer
                      (in_stack_fffffffffffffda0,
                       (AccumFunc)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                      );
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(*in_FS_OFFSET + -0x1c8) = *(long *)(*in_FS_OFFSET + -0x1c8) + 1;
          fVar6 = Dot<float>((Vector3<float> *)&local_c,(Vector3<float> *)&local_e0);
          if (fVar6 <= 0.0) {
            *(long *)(*in_FS_OFFSET + -0x1d0) = *(long *)(*in_FS_OFFSET + -0x1d0) + 1;
          }
          bVar2 = SameHemisphere((Vector3f *)&local_c,(Vector3f *)&local_154);
          if ((!bVar2) ||
             (fVar6 = Dot<float>((Vector3<float> *)&local_c,(Vector3<float> *)&local_e0),
             fVar6 <= 0.0)) {
            memset(in_RDI,0,0x24);
            BSDFSample::BSDFSample
                      ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          }
          else {
            FVar7 = TrowbridgeReitzDistribution::PDF
                              ((TrowbridgeReitzDistribution *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                               (Vector3f *)
                               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                               (Vector3f *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            fVar6 = Dot<float>((Vector3<float> *)&local_c,(Vector3<float> *)&local_e0);
            local_170 = ((FVar7 / (fVar6 * 4.0)) * local_144) / (local_144 + local_148);
            eVar3 = IsNaN<float>(0.0);
            if (eVar3) {
              LogFatal<char_const(&)[12]>
                        (LVar30,(char *)n,iVar4,(char *)CONCAT44(FVar7,in_stack_fffffffffffffdb8),
                         (char (*) [12])
                         CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
            }
            local_174 = AbsCosTheta((Vector3f *)0x7e5943);
            local_178 = AbsCosTheta((Vector3f *)0x7e5959);
            if (((local_178 == 0.0) && (!NAN(local_178))) ||
               ((local_174 == 0.0 && (!NAN(local_174))))) {
              memset(in_RDI,0,0x24);
              BSDFSample::BSDFSample
                        ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                        );
            }
            else {
              TrowbridgeReitzDistribution::D
                        ((TrowbridgeReitzDistribution *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         (Vector3f *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
              TrowbridgeReitzDistribution::G
                        ((TrowbridgeReitzDistribution *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (Vector3f *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (Vector3f *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
              SampledSpectrum::SampledSpectrum
                        ((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         in_stack_fffffffffffffd6c);
              BSDFSample::BSDFSample
                        (in_RDI,&local_188,(Vector3f *)&local_154,local_170,GlossyReflection);
            }
          }
        }
      }
      else {
        memset(in_RDI,0,0x24);
        BSDFSample::BSDFSample
                  ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      }
    }
  }
  else {
    memset(in_RDI,0,0x24);
    BSDFSample::BSDFSample
              ((BSDFSample *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (wo.z == 0)
            return {};

        if (mfDistrib.EffectivelySpecular()) {
            // Sample delta dielectric interface
            Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample perfect specular reflection at interface
                Vector3f wi(-wo.x, -wo.y, wo.z);
                SampledSpectrum fr(R / AbsCosTheta(wi));
                return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

            } else {
                // Sample perfect specular transmission at interface
                // Figure out which $\eta$ is incident and which is transmitted
                bool entering = CosTheta(wo) > 0;
                Float etap = entering ? eta : (1 / eta);

                // Compute ray direction for specular transmission
                Vector3f wi;
                bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (tir)
                    return {};

                SampledSpectrum ft(T / AbsCosTheta(wi));
                // Account for non-symmetry with transmission to different medium
                if (mode == TransportMode::Radiance)
                    ft /= Sqr(etap);

                return BSDFSample(ft, wi, pt / (pr + pt),
                                  BxDFFlags::SpecularTransmission);
            }

        } else {
            // Sample non-delta dielectric interface
            // Sample half-angle vector for outgoing direction and compute Frensel factor
            Vector3f wh = mfDistrib.Sample_wm(wo, u);
            Float F = FrDielectric(
                Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
            Float R = F, T = 1 - R;

            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample reflection at non-delta dielectric interface
                Vector3f wi = Reflect(wo, wh);
                CHECK_RARE(1e-6, Dot(wo, wh) <= 0);
                if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                    return {};

                // Compute PDF of _wi_ for microfacet reflection
                Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
                CHECK(!IsNaN(pdf));

                // TODO: reuse fragments from f()
                Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
                // Handle degenerate cases for microfacet reflection
                if (cosTheta_i == 0 || cosTheta_o == 0)
                    return {};
                SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                  (4 * cosTheta_i * cosTheta_o));
                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

            } else {
                // Sample transmission at non-delta dielectric interface
                // FIXME (make consistent): this etap is 1/etap as used in
                // specular...
                Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
                Vector3f wi;
                bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (SameHemisphere(wo, wi))
                    return {};
                if (tir || wi.z == 0)
                    return {};

                // Evaluate BSDF
                // TODO: share fragments with f(), PDF()...
                wh = FaceForward(wh, Normal3f(0, 0, 1));

                Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
                Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

                SampledSpectrum f(
                    (1 - F) * factor *
                    std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                             AbsDot(wo, wh) /
                             (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

                // Compute PDF
                Float dwh_dwi =
                    /*Sqr(etap) * */ AbsDot(wi, wh) /
                    Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
                Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
                CHECK(!IsNaN(pdf));

                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission);
            }
        }
    }